

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::huff_decode(jpeg_decoder *this,huff_tables *pH,int *extra_bits)

{
  uint uVar1;
  uint uVar2;
  uint num_bits;
  uint num_bits_00;
  int bits;
  int num_extra_bits;
  int code_size;
  uint idx;
  int ofs;
  int symbol;
  int *extra_bits_local;
  huff_tables *pH_local;
  jpeg_decoder *this_local;
  
  if (pH == (huff_tables *)0x0) {
    stop_decoding(this,JPGD_DECODE_ERROR);
  }
  idx = pH->look_up2[this->m_bit_buf >> 0x18];
  if ((int)idx < 0) {
    code_size = 0x17;
    do {
      uVar2 = -(idx + (this->m_bit_buf >> ((byte)code_size & 0x1f) & 1));
      if ((0x1ff < uVar2) || (code_size < 0)) {
        stop_decoding(this,JPGD_DECODE_ERROR);
      }
      idx = pH->tree[uVar2];
      code_size = code_size + -1;
    } while ((int)idx < 0);
    get_bits_no_markers(this,0x1f - code_size);
    uVar1 = get_bits_no_markers(this,idx & 0xf);
    *extra_bits = uVar1;
  }
  else {
    uVar2 = (int)idx >> 8;
    if ((idx & 0x8000) == 0) {
      num_bits = idx & 0xf;
      num_bits_00 = (uVar2 & 0x1f) + num_bits;
      if (num_bits_00 < 0x11) {
        uVar1 = get_bits_no_markers(this,num_bits_00);
        *extra_bits = uVar1 & (1 << (sbyte)num_bits) - 1U;
      }
      else {
        get_bits_no_markers(this,uVar2 & 0x1f);
        uVar1 = get_bits_no_markers(this,num_bits);
        *extra_bits = uVar1;
      }
    }
    else {
      if (0xf < (uVar2 & 0x1f)) {
        __assert_fail("((symbol >> 8) & 31) <= 15",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                      ,0x250,"int jpgd::jpeg_decoder::huff_decode(huff_tables *, int &)");
      }
      get_bits_no_markers(this,uVar2 & 0xf);
      *extra_bits = (int)idx >> 0x10;
    }
    idx = idx & 0xff;
  }
  return idx;
}

Assistant:

inline int jpeg_decoder::huff_decode(huff_tables* pH, int& extra_bits)
	{
		int symbol;

		if (!pH)
			stop_decoding(JPGD_DECODE_ERROR);

		// Check first 8-bits: do we have a complete symbol?
		if ((symbol = pH->look_up2[m_bit_buf >> 24]) < 0)
		{
			// Use a tree traversal to find symbol.
			int ofs = 23;
			do
			{
				unsigned int idx = -(int)(symbol + ((m_bit_buf >> ofs) & 1));

				// This should never happen, but to be safe I'm turning these asserts into a run-time check.
				if ((idx >= JPGD_HUFF_TREE_MAX_LENGTH) || (ofs < 0))
					stop_decoding(JPGD_DECODE_ERROR);

				symbol = pH->tree[idx];
				ofs--;
			} while (symbol < 0);

			get_bits_no_markers(8 + (23 - ofs));

			extra_bits = get_bits_no_markers(symbol & 0xF);
		}
		else
		{
			if (symbol & 0x8000)
			{
				//get_bits_no_markers((symbol >> 8) & 31);
				assert(((symbol >> 8) & 31) <= 15);
				get_bits_no_markers((symbol >> 8) & 15);
				extra_bits = symbol >> 16;
			}
			else
			{
				int code_size = (symbol >> 8) & 31;
				int num_extra_bits = symbol & 0xF;
				int bits = code_size + num_extra_bits;

				if (bits <= 16)
					extra_bits = get_bits_no_markers(bits) & ((1 << num_extra_bits) - 1);
				else
				{
					get_bits_no_markers(code_size);
					extra_bits = get_bits_no_markers(num_extra_bits);
				}
			}

			symbol &= 0xFF;
		}

		return symbol;
	}